

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O3

void add_pax_attr_time(archive_string *as,char *key,int64_t sec,unsigned_long nanos)

{
  bool bVar1;
  size_t value_len;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  char *__s;
  char tmp [50];
  char local_28 [16];
  
  pcVar6 = local_28 + 1;
  local_28[1] = 0;
  uVar5 = 0xb;
  do {
    uVar4 = uVar5;
    uVar3 = nanos / 10;
    uVar2 = nanos % 10;
    uVar5 = uVar4 - 1;
    if (uVar4 == 2) break;
    nanos = uVar3;
  } while (uVar2 == 0);
  if (uVar4 != 2) {
    if (1 < (int)uVar5) {
      do {
        pcVar6[-1] = "0123456789"[uVar2];
        pcVar6 = pcVar6 + -1;
        uVar2 = uVar3 % 10;
        uVar5 = uVar5 - 1;
        uVar3 = uVar3 / 10;
      } while (1 < uVar5);
    }
    pcVar6[-1] = '.';
    pcVar6 = pcVar6 + -1;
  }
  uVar3 = -sec;
  if (0 < sec) {
    uVar3 = sec;
  }
  pcVar6 = pcVar6 + -1;
  do {
    __s = pcVar6;
    *__s = "0123456789"[uVar3 % 10];
    pcVar6 = __s + -1;
    bVar1 = 9 < uVar3;
    uVar3 = uVar3 / 10;
  } while (bVar1);
  if (sec < 0) {
    *pcVar6 = '-';
    __s = pcVar6;
  }
  value_len = strlen(__s);
  add_pax_attr_binary(as,key,__s,value_len);
  return;
}

Assistant:

static void
add_pax_attr_time(struct archive_string *as, const char *key,
    int64_t sec, unsigned long nanos)
{
	int digit, i;
	char *t;
	/*
	 * Note that each byte contributes fewer than 3 base-10
	 * digits, so this will always be big enough.
	 */
	char tmp[1 + 3*sizeof(sec) + 1 + 3*sizeof(nanos)];

	tmp[sizeof(tmp) - 1] = 0;
	t = tmp + sizeof(tmp) - 1;

	/* Skip trailing zeros in the fractional part. */
	for (digit = 0, i = 10; i > 0 && digit == 0; i--) {
		digit = nanos % 10;
		nanos /= 10;
	}

	/* Only format the fraction if it's non-zero. */
	if (i > 0) {
		while (i > 0) {
			*--t = "0123456789"[digit];
			digit = nanos % 10;
			nanos /= 10;
			i--;
		}
		*--t = '.';
	}
	t = format_int(t, sec);

	add_pax_attr(as, key, t);
}